

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

complexEssentials_t *
opengv::relative_pose::fivept_stewenius
          (complexEssentials_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices
          )

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t rows;
  ulong uVar4;
  double dVar5;
  complexEssentials_t *pcVar6;
  undefined8 uVar7;
  int iVar8;
  undefined8 *puVar9;
  double *pdVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  size_t sVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  MatrixXd Q;
  bearingVector_t fprime;
  Matrix<double,_9,_4,_0,_9,_4> EE;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  DenseStorage<double,__1,__1,__1,_0> local_3e0;
  complexEssentials_t *local_3c8;
  undefined1 local_3c0 [16];
  double local_3b0 [2];
  Matrix<double,_9,_4,_0,_9,_4> local_3a0;
  undefined1 local_278 [584];
  
  rows = indices->_numberCorrespondences;
  local_3e0.m_data = (double *)0x0;
  local_3e0.m_rows = 0;
  local_3e0.m_cols = 0;
  if ((long)rows < 0xe38e38e38e38e39) {
    local_3c8 = __return_storage_ptr__;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_3e0,rows * 9,rows,9);
    if (rows != 0) {
      sVar14 = 0;
      do {
        iVar13 = (int)sVar14;
        iVar8 = iVar13;
        if (indices->_useIndices == true) {
          iVar8 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar13];
        }
        (*adapter->_vptr_RelativeAdapterBase[3])(&local_3a0,adapter,(long)iVar8);
        if (indices->_useIndices == true) {
          iVar13 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar13];
        }
        (*adapter->_vptr_RelativeAdapterBase[2])(local_3c0,adapter,(long)iVar13);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>.
                       m_storage.m_data.array[2];
        auVar15 = vbroadcastsd_avx512f(auVar1);
        auVar16 = vpermt2pd_avx512f(_DAT_002595c0,auVar15);
        vinsertf32x4_avx512f(ZEXT1664(local_3c0),local_3c0,1);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = local_3b0[0];
        auVar17 = vbroadcastsd_avx512f(auVar2);
        auVar18 = vpermt2pd_avx512f(_DAT_00259600,auVar17);
        local_278._0_64_ = vmulpd_avx512f(auVar16,auVar18);
        local_278._64_8_ = auVar15._0_8_ * auVar17._0_8_;
        auVar15 = vpbroadcastq_avx512f(ZEXT816(8));
        if (0 < local_3e0.m_cols) {
          auVar16 = vpbroadcastq_avx512f();
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_3e0.m_rows;
          auVar17 = vpbroadcastq_avx512f(auVar3);
          uVar11 = 0;
          auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            uVar4 = vpcmpuq_avx512f(auVar18,auVar16,2);
            auVar19 = vpmullq_avx512dq(auVar18,auVar17);
            lVar12 = uVar11 * 8;
            auVar20._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * *(long *)(local_278 + lVar12 + 8);
            auVar20._0_8_ = (ulong)((byte)uVar4 & 1) * *(long *)(local_278 + lVar12);
            auVar20._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * *(long *)(local_278 + lVar12 + 0x10);
            auVar20._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * *(long *)(local_278 + lVar12 + 0x18);
            auVar20._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * *(long *)(local_278 + lVar12 + 0x20);
            auVar20._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * *(long *)(local_278 + lVar12 + 0x28);
            auVar20._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * *(long *)(local_278 + lVar12 + 0x30);
            auVar20._56_8_ = (uVar4 >> 7) * *(long *)(local_278 + lVar12 + 0x38);
            vscatterqpd_avx512f(ZEXT864(local_3e0.m_data + sVar14) + auVar19 * (undefined1  [64])0x8
                                ,uVar4,auVar20);
            uVar11 = uVar11 + 8;
            auVar18 = vpaddq_avx512f(auVar18,auVar15);
          } while ((local_3e0.m_cols + 7U & 0xfffffffffffffff8) != uVar11);
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 != rows);
    }
    Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
              ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_278,
               (MatrixType *)&local_3e0,0x10);
    pcVar6 = local_3c8;
    uVar7 = local_278._32_8_;
    pdVar10 = (double *)(local_278._24_8_ + (local_278._32_8_ * 5 + 8) * 8);
    lVar12 = 0x40;
    do {
      dVar5 = pdVar10[-7];
      *(double *)((long)&local_3e0.m_data + lVar12) = pdVar10[-8];
      *(double *)((long)&local_3e0.m_rows + lVar12) = dVar5;
      dVar5 = pdVar10[-5];
      *(double *)((long)&local_3e0.m_cols + lVar12) = pdVar10[-6];
      *(double *)(local_3c0 + lVar12 + -8) = dVar5;
      dVar5 = pdVar10[-3];
      *(double *)(local_3c0 + lVar12) = pdVar10[-4];
      *(double *)(local_3c0 + lVar12 + 8) = dVar5;
      dVar5 = pdVar10[-1];
      *(double *)((long)local_3b0 + lVar12) = pdVar10[-2];
      *(double *)((long)local_3b0 + lVar12 + 8) = dVar5;
      *(double *)
       ((long)local_3a0.super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>.m_storage.
              m_data.array + lVar12) = *pdVar10;
      lVar12 = lVar12 + 0x48;
      pdVar10 = pdVar10 + uVar7;
    } while (lVar12 != 0x160);
    (local_3c8->
    super__Vector_base<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_3c8->
    super__Vector_base<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_3c8->
    super__Vector_base<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    modules::fivept_stewenius_main(&local_3a0,local_3c8);
    Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD
              ((JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *)local_278);
    if (local_3e0.m_data != (double *)0x0) {
      free((void *)local_3e0.m_data[-1]);
    }
    return pcVar6;
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar9 = acos;
  __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

complexEssentials_t fivept_stewenius(
    const RelativeAdapterBase & adapter,
    const Indices & indices )
{
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 4);

  Eigen::MatrixXd Q(numberCorrespondences,9);
  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    //bearingVector_t f = adapter.getBearingVector1(indices[i]);
    //bearingVector_t fprime = adapter.getBearingVector2(indices[i]);
    //Stewenius' algorithm is computing the inverse transformation, so we simply
    //invert the input here
    bearingVector_t f = adapter.getBearingVector2(indices[i]);
    bearingVector_t fprime = adapter.getBearingVector1(indices[i]);
    Eigen::Matrix<double,1,9> row;
    row <<  f[0]*fprime[0], f[1]*fprime[0], f[2]*fprime[0],
        f[0]*fprime[1], f[1]*fprime[1], f[2]*fprime[1],
        f[0]*fprime[2], f[1]*fprime[2], f[2]*fprime[2];
    Q.row(i) = row;
  }

  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(Q, Eigen::ComputeFullV );
  Eigen::Matrix<double,9,4> EE = SVD.matrixV().block(0,5,9,4);
  complexEssentials_t complexEssentials;
  modules::fivept_stewenius_main(EE,complexEssentials);
  return complexEssentials;
}